

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void duckdb::
     LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::SortKeyLeastGreatest>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  string_t *psVar2;
  unsigned_long *puVar3;
  Vector *this;
  data_ptr_t pdVar4;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar5;
  bool bVar6;
  reference pvVar7;
  DataChunk *this_00;
  ulong uVar8;
  size_type sVar9;
  string_t *psVar10;
  ulong uVar11;
  VectorType vector_type_p;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  anon_union_16_2_67f50693_for_value local_8a8;
  ExpressionState *local_890;
  Vector *local_888;
  UnifiedVectorFormat local_880;
  optional_ptr<duckdb::FunctionLocalState,_true> local_838 [257];
  
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar7);
    return;
  }
  local_888 = result;
  this_00 = SortKeyLeastGreatest::Prepare(args,state);
  local_838[0].ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
  local_890 = state;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(local_838);
  oVar5.ptr = local_838[0].ptr;
  if ((this_00->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this_00->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    vector_type_p = CONSTANT_VECTOR;
  }
  else {
    vector_type_p = CONSTANT_VECTOR;
    sVar9 = 0;
    do {
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar9);
      if (pvVar7->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)(((long)(this_00->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  psVar2 = (string_t *)oVar5.ptr[0xd]._vptr_FunctionLocalState;
  switchD_0105dc25::default(local_838,0,0x800);
  if ((this_00->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this_00->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar9 = 0;
    do {
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&this_00->data,sVar9);
      if (pvVar7->vector_type == CONSTANT_VECTOR) {
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&this_00->data,sVar9);
        puVar3 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) goto LAB_01a98ad1;
      }
      else {
LAB_01a98ad1:
        UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&this_00->data,sVar9);
        Vector::ToUnifiedFormat(pvVar7,this_00->count,&local_880);
        pdVar4 = local_880.data;
        if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (this_00->count != 0) {
            uVar11 = 0;
            psVar10 = psVar2;
            do {
              uVar8 = uVar11;
              if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
                uVar8 = (ulong)(local_880.sel)->sel_vector[uVar11];
              }
              pdVar1 = pdVar4 + uVar8 * 0x10;
              local_8a8._0_8_ = *(undefined8 *)pdVar1;
              local_8a8.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
              if ((*(char *)((long)&local_838[0].ptr + uVar11) != '\x01') ||
                 (bVar6 = string_t::StringComparisonOperators::GreaterThan
                                    ((string_t *)&local_8a8.pointer,psVar10), bVar6)) {
                *(undefined1 *)((long)&local_838[0].ptr + uVar11) = 1;
                *(undefined8 *)&psVar10->value = local_8a8._0_8_;
                (psVar10->value).pointer.ptr = local_8a8.pointer.ptr;
              }
              uVar11 = uVar11 + 1;
              psVar10 = psVar10 + 1;
            } while (uVar11 < this_00->count);
          }
        }
        else if (this_00->count != 0) {
          uVar11 = 0;
          psVar10 = psVar2;
          do {
            uVar8 = uVar11;
            if ((local_880.sel)->sel_vector != (sel_t *)0x0) {
              uVar8 = (ulong)(local_880.sel)->sel_vector[uVar11];
            }
            if ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
              pdVar1 = pdVar4 + uVar8 * 0x10;
              local_8a8._0_8_ = *(undefined8 *)pdVar1;
              local_8a8.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
              if ((*(char *)((long)&local_838[0].ptr + uVar11) != '\x01') ||
                 (bVar6 = string_t::StringComparisonOperators::GreaterThan
                                    ((string_t *)&local_8a8.pointer,psVar10), bVar6)) {
                *(undefined1 *)((long)&local_838[0].ptr + uVar11) = 1;
                *(undefined8 *)&psVar10->value = local_8a8._0_8_;
                (psVar10->value).pointer.ptr = local_8a8.pointer.ptr;
              }
            }
            uVar11 = uVar11 + 1;
            psVar10 = psVar10 + 1;
          } while (uVar11 < this_00->count);
        }
        if (local_880.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_880.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)(((long)(this_00->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  this = local_888;
  SortKeyLeastGreatest::FinalizeResult(this_00->count,(bool *)local_838,local_888,local_890);
  Vector::SetVectorType(this,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}